

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_todo.cpp
# Opt level: O2

void __thiscall Am_Window_ToDo::Remove(Am_Window_ToDo *this)

{
  Am_Window_ToDo *pAVar1;
  Am_Window_ToDo *pAVar2;
  Am_Window_ToDo *pAVar3;
  Am_Window_ToDo **ppAVar4;
  
  pAVar3 = this->prev;
  pAVar1 = this->next;
  if (((pAVar3 == (Am_Window_ToDo *)0x0) && (pAVar1 == (Am_Window_ToDo *)0x0)) &&
     (Window_ToDo_Head != this)) {
    return;
  }
  pAVar2 = pAVar3;
  if (pAVar1 != (Am_Window_ToDo *)0x0) {
    pAVar1->prev = pAVar3;
    pAVar3 = this->prev;
    pAVar2 = Window_ToDo_Tail;
  }
  Window_ToDo_Tail = pAVar2;
  if (pAVar3 == (Am_Window_ToDo *)0x0) {
    ppAVar4 = &Window_ToDo_Head;
  }
  else {
    ppAVar4 = &pAVar3->next;
  }
  *ppAVar4 = pAVar1;
  this->prev = (Am_Window_ToDo *)0x0;
  this->next = (Am_Window_ToDo *)0x0;
  return;
}

Assistant:

void
Am_Window_ToDo::Remove()
{
  if (prev || next || (Window_ToDo_Head == this)) {
    if (next)
      next->prev = prev;
    else
      Window_ToDo_Tail = prev;
    if (prev)
      prev->next = next;
    else
      Window_ToDo_Head = next;
    prev = nullptr;
    next = nullptr;
  }
}